

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem_utils.cpp
# Opt level: O2

bool FileSysUtilsCombinePaths(string *parent,string *child,string *combined)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (((parent->_M_string_length == 0) || (bVar1 = std::operator==(".",parent), bVar1)) ||
     (bVar1 = std::operator==("./",parent), bVar1)) {
    std::__cxx11::string::_M_assign((string *)combined);
  }
  else {
    std::__cxx11::string::substr((ulong)&local_60,(ulong)parent);
    std::operator+(&local_80,&local_60,'/');
    std::operator+(&local_40,&local_80,child);
    std::__cxx11::string::operator=((string *)combined,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_60);
  }
  return true;
}

Assistant:

bool FileSysUtilsCombinePaths(const std::string& parent, const std::string& child, std::string& combined) {
    std::string::size_type parent_len = parent.length();
    if (0 == parent_len || "." == parent || "./" == parent) {
        combined = child;
        return true;
    }
    char last_char = parent[parent_len - 1];
    if (last_char == DIRECTORY_SYMBOL) {
        parent_len--;
    }
    combined = parent.substr(0, parent_len) + DIRECTORY_SYMBOL + child;
    return true;
}